

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

bool __thiscall soul::Value::PackedData::getAsBool(PackedData *this)

{
  bool bVar1;
  uchar uVar2;
  int64_t iVar3;
  double dVar4;
  bool local_19;
  PackedData *this_local;
  
  bVar1 = Type::isPrimitive(this->type);
  local_19 = true;
  if (!bVar1) {
    bVar1 = Type::isBoundedInt(this->type);
    local_19 = true;
    if (!bVar1) {
      local_19 = Type::isVectorOfSize1(this->type);
    }
  }
  checkAssertion(local_19,"type.isPrimitive() || type.isBoundedInt() || type.isVectorOfSize1()",
                 "getAsBool",0x8b);
  bVar1 = Type::isBool(this->type);
  if (bVar1) {
    uVar2 = getAs<unsigned_char>(this);
    this_local._7_1_ = uVar2 != '\0';
  }
  else {
    bVar1 = Type::isInteger(this->type);
    if (bVar1) {
      iVar3 = getAsInt64(this);
      this_local._7_1_ = iVar3 != 0;
    }
    else {
      bVar1 = Type::isFloatingPoint(this->type);
      if (!bVar1) {
        throwInternalCompilerError("getAsBool",0x91);
      }
      dVar4 = getAsDouble(this);
      this_local._7_1_ = dVar4 != 0.0;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool getAsBool() const
    {
        SOUL_ASSERT (type.isPrimitive() || type.isBoundedInt() || type.isVectorOfSize1());

        if (type.isBool())           return getAs<uint8_t>() != 0;
        if (type.isInteger())        return getAsInt64() != 0;
        if (type.isFloatingPoint())  return getAsDouble() != 0;

        SOUL_ASSERT_FALSE;
        return false;
    }